

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O2

int __thiscall SightCheck::init(SightCheck *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  sector_t_conflict *in_RCX;
  AActor *in_RDX;
  double *in_R8;
  int in_R9D;
  double dVar5;
  DVector3 local_48;
  
  AActor::PosRelative(&local_48,(AActor *)ctx,*(int *)((long)in_R8 + 0x1c));
  (this->sightstart).Z = local_48.Z;
  (this->sightstart).X = local_48.X;
  (this->sightstart).Y = local_48.Y;
  AActor::PosRelative(&local_48,in_RDX,*(int *)((long)in_R8 + 0x1c));
  (this->sightend).X = local_48.X;
  (this->sightend).Y = local_48.Y;
  dVar5 = *(double *)(ctx + 0x180) * 0.75 + (this->sightstart).Z;
  (this->sightstart).Z = dVar5;
  this->Startfrac = *in_R8;
  dVar3 = (this->sightstart).X;
  dVar4 = (this->sightstart).Y;
  local_48.X = local_48.X - dVar3;
  local_48.Y = local_48.Y - dVar4;
  (this->Trace).x = dVar3;
  (this->Trace).y = dVar4;
  auVar2._8_4_ = SUB84(local_48.Y,0);
  auVar2._0_8_ = local_48.X;
  auVar2._12_4_ = (int)((ulong)local_48.Y >> 0x20);
  (this->Trace).dx = local_48.X;
  (this->Trace).dy = (double)auVar2._8_8_;
  this->Lastzbottom = dVar5;
  this->Lastztop = dVar5;
  this->lastsector = in_RCX;
  this->seeingthing = in_RDX;
  dVar3 = in_R8[2];
  this->topslope = in_R8[1];
  this->bottomslope = dVar3;
  this->Flags = in_R9D;
  iVar1 = *(int *)(in_R8 + 3);
  this->portaldir = iVar1;
  this->portalfound = false;
  this->myseethrough = 0x2000000;
  return iVar1;
}

Assistant:

void init(AActor * t1, AActor * t2, sector_t *startsector, SightTask *task, int flags)
	{
		sightstart = t1->PosRelative(task->portalgroup);
		sightend = t2->PosRelative(task->portalgroup);
		sightstart.Z += t1->Height * 0.75;

		Startfrac = task->Frac;
		Trace = { sightstart.X, sightstart.Y, sightend.X - sightstart.X, sightend.Y - sightstart.Y };
		Lastztop = Lastzbottom = sightstart.Z;
		lastsector = startsector;
		seeingthing=t2;
		topslope = task->topslope;
		bottomslope = task->bottomslope;
		Flags = flags;
		portaldir = task->direction;
		portalfound = false;

		myseethrough = FF_SEETHROUGH;
	}